

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

void Llb_ManCutPrint(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Ptr_t *vMinCut;
  Vec_Ptr_t *vMinCut_00;
  
  uVar1 = Llb_ManCutPiNum(p,vLower);
  uVar2 = Llb_ManCutLoNum(p,vLower);
  printf("Leaf: %3d=%3d+%3d+%3d  ",(ulong)(uint)vLower->nSize,(ulong)uVar1,(ulong)uVar2,
         (ulong)((vLower->nSize - uVar2) - uVar1));
  uVar1 = Llb_ManCutPiNum(p,vUpper);
  uVar2 = Llb_ManCutLiNum(p,vUpper);
  printf("Root: %3d=%3d+%3d+%3d  ",(ulong)(uint)vUpper->nSize,(ulong)uVar1,(ulong)uVar2,
         (ulong)((vUpper->nSize - uVar2) - uVar1));
  vMinCut = Llb_ManCutSupp(p,vLower,vUpper);
  uVar2 = Llb_ManCutPiNum(p,vMinCut);
  uVar3 = Llb_ManCutLoNum(p,vMinCut);
  uVar1 = vMinCut->nSize;
  printf("Supp: %3d=%3d+%3d+%3d  ",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
         (ulong)((uVar1 - uVar3) - uVar2));
  vMinCut_00 = Llb_ManCutRange(p,vLower,vUpper);
  uVar3 = Llb_ManCutPiNum(p,vMinCut_00);
  uVar4 = Llb_ManCutLiNum(p,vMinCut_00);
  uVar2 = vMinCut_00->nSize;
  printf("Range: %3d=%3d+%3d+%3d  ",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
         (ulong)((uVar2 - uVar4) - uVar3));
  uVar3 = Llb_ManCutVolume(p,vLower,vUpper);
  printf("S =%3d. V =%3d.\n",(ulong)(uVar2 + uVar1),(ulong)uVar3);
  Vec_PtrFree(vMinCut);
  Vec_PtrFree(vMinCut_00);
  return;
}

Assistant:

void Llb_ManCutPrint( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Vec_Ptr_t * vSupp, * vRange;
    int Pis, Ffs, And;

    Pis = Llb_ManCutPiNum(p, vLower);
    Ffs = Llb_ManCutLoNum(p, vLower);
    And = Vec_PtrSize(vLower) - Pis - Ffs;
    printf( "Leaf: %3d=%3d+%3d+%3d  ",  Vec_PtrSize(vLower), Pis, Ffs, And );

    Pis = Llb_ManCutPiNum(p, vUpper);
    Ffs = Llb_ManCutLiNum(p, vUpper);
    And = Vec_PtrSize(vUpper) - Pis - Ffs;
    printf( "Root: %3d=%3d+%3d+%3d  ", Vec_PtrSize(vUpper), Pis, Ffs, And );

    vSupp = Llb_ManCutSupp( p, vLower, vUpper );
    Pis = Llb_ManCutPiNum(p, vSupp);
    Ffs = Llb_ManCutLoNum(p, vSupp);
    And = Vec_PtrSize(vSupp) - Pis - Ffs;
    printf( "Supp: %3d=%3d+%3d+%3d  ", Vec_PtrSize(vSupp), Pis, Ffs, And );

    vRange = Llb_ManCutRange( p, vLower, vUpper );
    Pis = Llb_ManCutPiNum(p, vRange);
    Ffs = Llb_ManCutLiNum(p, vRange);
    And = Vec_PtrSize(vRange) - Pis - Ffs;
    printf( "Range: %3d=%3d+%3d+%3d  ", Vec_PtrSize(vRange), Pis, Ffs, And );

    printf( "S =%3d. V =%3d.\n", 
        Vec_PtrSize(vSupp)+Vec_PtrSize(vRange), Llb_ManCutVolume(p, vLower, vUpper) );
    Vec_PtrFree( vSupp );
    Vec_PtrFree( vRange );
/*   
    {
        Aig_Obj_t * pObj;
        int i;
        printf( "Lower: " );
        Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
            printf( " %d", pObj->Id );
        printf( "     " );
        printf( "Upper: " );
        Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
            printf( " %d", pObj->Id );
        printf( "\n" );
    }
*/
}